

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

void Psr_ManWriteVerilogSignal(FILE *pFile,Psr_Ntk_t *p,int Sig)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  uint NameId;
  
  if (Sig < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x13d,"int Abc_Lit2Var2(int)");
  }
  NameId = (uint)Sig >> 2;
  if ((Sig & 1U) == 0) {
    pcVar3 = Abc_NamStr(p->pStrs,NameId);
    fputs(pcVar3,(FILE *)pFile);
    return;
  }
  if ((Sig & 3U) == 3) {
    iVar1 = (p->vConcats).nSize;
    if ((int)NameId < iVar1) {
      piVar2 = (p->vConcats).pArray;
      Psr_CatSignals_V._0_4_ = piVar2[NameId];
      Psr_CatSignals_V._4_4_ = Psr_CatSignals_V._0_4_;
      if ((int)(NameId + 1) < iVar1) {
        Psr_CatSignals_V._8_8_ = piVar2 + (NameId + 1);
        fputc(0x7b,(FILE *)pFile);
        Psr_ManWriteVerilogArray(pFile,p,(Vec_Int_t *)Psr_CatSignals_V,0,Psr_CatSignals_V._4_4_,0);
        fputc(0x7d,(FILE *)pFile);
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
  else {
    if ((Sig & 3U) != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                    ,0x41,"void Psr_ManWriteVerilogSignal(FILE *, Psr_Ntk_t *, int)");
    }
    if ((int)NameId < (p->vSlices).nSize) {
      pcVar3 = Abc_NamStr(p->pStrs,(p->vSlices).pArray[NameId]);
      if ((int)(NameId + 1) < (p->vSlices).nSize) {
        pcVar4 = Abc_NamStr(p->pStrs,(p->vSlices).pArray[NameId + 1]);
        fprintf((FILE *)pFile,"%s%s",pcVar3,pcVar4);
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static void Psr_ManWriteVerilogSignal( FILE * pFile, Psr_Ntk_t * p, int Sig )
{
    int Value = Abc_Lit2Var2( Sig );
    Psr_ManType_t Type = (Psr_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == BAC_PRS_NAME || Type == BAC_PRS_CONST )
        fprintf( pFile, "%s", Psr_NtkStr(p, Value) );
    else if ( Type == BAC_PRS_SLICE )
        fprintf( pFile, "%s%s", Psr_NtkStr(p, Psr_SliceName(p, Value)), Psr_NtkStr(p, Psr_SliceRange(p, Value)) );
    else if ( Type == BAC_PRS_CONCAT )
        Psr_ManWriteVerilogConcat( pFile, p, Value );
    else assert( 0 );
}